

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExportTest.cpp
# Opt level: O2

DDLNode * __thiscall ODDLParser::OpenDDLExportTest::createNodeHierarchy(OpenDDLExportTest *this)

{
  DDLNode *parent;
  DDLNode *this_00;
  int iVar1;
  bool bVar2;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"test",&local_71);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"root",&local_72);
  parent = DDLNode::create(&local_50,&local_70,(DDLNode *)0x0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  iVar1 = 10;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"test",&local_71);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"child",&local_72);
    this_00 = DDLNode::create(&local_50,&local_70,(DDLNode *)0x0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    DDLNode::attachParent(this_00,parent);
  }
  return parent;
}

Assistant:

DDLNode *createNodeHierarchy() {
        DDLNode *root = DDLNode::create("test", "root");
        for (uint32 i = 0; i < 10; i++) {
            DDLNode *node(DDLNode::create("test", "child"));
            node->attachParent(root);
        }

        return root;
    }